

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.h
# Opt level: O1

void __thiscall despot::util::tinyxml::TiXmlPrinter::~TiXmlPrinter(TiXmlPrinter *this)

{
  Rep *pRVar1;
  
  *(undefined ***)this = &PTR__TiXmlPrinter_00191850;
  pRVar1 = (this->lineBreak).rep_;
  if (pRVar1 != (Rep *)0x0 && pRVar1 != (Rep *)&TiXmlString::nullrep_) {
    operator_delete__(pRVar1);
  }
  pRVar1 = (this->indent).rep_;
  if (pRVar1 != (Rep *)0x0 && pRVar1 != (Rep *)&TiXmlString::nullrep_) {
    operator_delete__(pRVar1);
  }
  pRVar1 = (this->buffer).rep_;
  if (pRVar1 != (Rep *)0x0 && pRVar1 != (Rep *)&TiXmlString::nullrep_) {
    operator_delete__(pRVar1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

TiXmlPrinter() :
		depth(0),
		simpleTextPrint(false),
		buffer(),
		indent("    "),
		lineBreak("\n") {
	}